

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joint.h
# Opt level: O2

Joint * __thiscall RigidBodyDynamics::Joint::operator=(Joint *this,Joint *joint)

{
  SpatialVector *pSVar1;
  uint i;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  if (this != joint) {
    if ((this->mDoFCount != 0) && (this->mJointAxes != (SpatialVector *)0x0)) {
      operator_delete__(this->mJointAxes);
    }
    this->mJointType = joint->mJointType;
    uVar3 = (ulong)joint->mDoFCount;
    this->mDoFCount = joint->mDoFCount;
    this->custom_joint_index = joint->custom_joint_index;
    pSVar1 = (SpatialVector *)operator_new__(uVar3 * 0x30);
    this->mJointAxes = pSVar1;
    lVar4 = 0;
    for (uVar2 = 0; uVar2 < uVar3; uVar2 = uVar2 + 1) {
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Matrix<double,6,1,0,6,1>>
                ((Matrix<double,_6,_1,_0,_6,_1> *)
                 ((long)(this->mJointAxes->super_Matrix<double,_6,_1,_0,_6,_1>).
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array + lVar4),
                 (Matrix<double,_6,_1,_0,_6,_1> *)
                 ((long)(joint->mJointAxes->super_Matrix<double,_6,_1,_0,_6,_1>).
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array + lVar4));
      uVar3 = (ulong)this->mDoFCount;
      lVar4 = lVar4 + 0x30;
    }
    this->q_index = joint->q_index;
  }
  return this;
}

Assistant:

Joint& operator= (const Joint &joint)
  {
    if (this != &joint) {
      if (mDoFCount > 0) {
        assert (mJointAxes);
        delete[] mJointAxes;
      }
      mJointType = joint.mJointType;
      mDoFCount = joint.mDoFCount;
      custom_joint_index = joint.custom_joint_index;
      mJointAxes = new Math::SpatialVector[mDoFCount];

      for (unsigned int i = 0; i < mDoFCount; i++) {
        mJointAxes[i] = joint.mJointAxes[i];
      }

      q_index = joint.q_index;
    }
    return *this;
  }